

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O1

ON_Locale * ON_Locale::FromWindowsName(ON_Locale *__return_storage_ptr__,char *locale_name)

{
  bool bVar1;
  char *pcVar2;
  ON__UINT32 OVar3;
  int line_number;
  ON_Locale *__src;
  char *name;
  ON_String cleaned_loc;
  char language_subtag [32];
  char region_subtag [32];
  char windows_sortorder [32];
  char script_subtag [32];
  
  if (locale_name == (char *)0x0) {
LAB_004d3689:
    __src = &InvariantCulture;
  }
  else {
    if (*locale_name == 'C') {
      if (locale_name[1] != '\0') goto LAB_004d369f;
    }
    else {
      if (*locale_name == '\0') goto LAB_004d3689;
LAB_004d369f:
      language_subtag[0x10] = '\0';
      language_subtag[0x11] = '\0';
      language_subtag[0x12] = '\0';
      language_subtag[0x13] = '\0';
      language_subtag[0x14] = '\0';
      language_subtag[0x15] = '\0';
      language_subtag[0x16] = '\0';
      language_subtag[0x17] = '\0';
      language_subtag[0x18] = '\0';
      language_subtag[0x19] = '\0';
      language_subtag[0x1a] = '\0';
      language_subtag[0x1b] = '\0';
      language_subtag[0x1c] = '\0';
      language_subtag[0x1d] = '\0';
      language_subtag[0x1e] = '\0';
      language_subtag[0x1f] = '\0';
      language_subtag[0] = '\0';
      language_subtag[1] = '\0';
      language_subtag[2] = '\0';
      language_subtag[3] = '\0';
      language_subtag[4] = '\0';
      language_subtag[5] = '\0';
      language_subtag[6] = '\0';
      language_subtag[7] = '\0';
      language_subtag[8] = '\0';
      language_subtag[9] = '\0';
      language_subtag[10] = '\0';
      language_subtag[0xb] = '\0';
      language_subtag[0xc] = '\0';
      language_subtag[0xd] = '\0';
      language_subtag[0xe] = '\0';
      language_subtag[0xf] = '\0';
      script_subtag[0x10] = '\0';
      script_subtag[0x11] = '\0';
      script_subtag[0x12] = '\0';
      script_subtag[0x13] = '\0';
      script_subtag[0x14] = '\0';
      script_subtag[0x15] = '\0';
      script_subtag[0x16] = '\0';
      script_subtag[0x17] = '\0';
      script_subtag[0x18] = '\0';
      script_subtag[0x19] = '\0';
      script_subtag[0x1a] = '\0';
      script_subtag[0x1b] = '\0';
      script_subtag[0x1c] = '\0';
      script_subtag[0x1d] = '\0';
      script_subtag[0x1e] = '\0';
      script_subtag[0x1f] = '\0';
      script_subtag[0] = '\0';
      script_subtag[1] = '\0';
      script_subtag[2] = '\0';
      script_subtag[3] = '\0';
      script_subtag[4] = '\0';
      script_subtag[5] = '\0';
      script_subtag[6] = '\0';
      script_subtag[7] = '\0';
      script_subtag[8] = '\0';
      script_subtag[9] = '\0';
      script_subtag[10] = '\0';
      script_subtag[0xb] = '\0';
      script_subtag[0xc] = '\0';
      script_subtag[0xd] = '\0';
      script_subtag[0xe] = '\0';
      script_subtag[0xf] = '\0';
      region_subtag[0x10] = '\0';
      region_subtag[0x11] = '\0';
      region_subtag[0x12] = '\0';
      region_subtag[0x13] = '\0';
      region_subtag[0x14] = '\0';
      region_subtag[0x15] = '\0';
      region_subtag[0x16] = '\0';
      region_subtag[0x17] = '\0';
      region_subtag[0x18] = '\0';
      region_subtag[0x19] = '\0';
      region_subtag[0x1a] = '\0';
      region_subtag[0x1b] = '\0';
      region_subtag[0x1c] = '\0';
      region_subtag[0x1d] = '\0';
      region_subtag[0x1e] = '\0';
      region_subtag[0x1f] = '\0';
      region_subtag[0] = '\0';
      region_subtag[1] = '\0';
      region_subtag[2] = '\0';
      region_subtag[3] = '\0';
      region_subtag[4] = '\0';
      region_subtag[5] = '\0';
      region_subtag[6] = '\0';
      region_subtag[7] = '\0';
      region_subtag[8] = '\0';
      region_subtag[9] = '\0';
      region_subtag[10] = '\0';
      region_subtag[0xb] = '\0';
      region_subtag[0xc] = '\0';
      region_subtag[0xd] = '\0';
      region_subtag[0xe] = '\0';
      region_subtag[0xf] = '\0';
      windows_sortorder[0x10] = '\0';
      windows_sortorder[0x11] = '\0';
      windows_sortorder[0x12] = '\0';
      windows_sortorder[0x13] = '\0';
      windows_sortorder[0x14] = '\0';
      windows_sortorder[0x15] = '\0';
      windows_sortorder[0x16] = '\0';
      windows_sortorder[0x17] = '\0';
      windows_sortorder[0x18] = '\0';
      windows_sortorder[0x19] = '\0';
      windows_sortorder[0x1a] = '\0';
      windows_sortorder[0x1b] = '\0';
      windows_sortorder[0x1c] = '\0';
      windows_sortorder[0x1d] = '\0';
      windows_sortorder[0x1e] = '\0';
      windows_sortorder[0x1f] = '\0';
      windows_sortorder[0] = '\0';
      windows_sortorder[1] = '\0';
      windows_sortorder[2] = '\0';
      windows_sortorder[3] = '\0';
      windows_sortorder[4] = '\0';
      windows_sortorder[5] = '\0';
      windows_sortorder[6] = '\0';
      windows_sortorder[7] = '\0';
      windows_sortorder[8] = '\0';
      windows_sortorder[9] = '\0';
      windows_sortorder[10] = '\0';
      windows_sortorder[0xb] = '\0';
      windows_sortorder[0xc] = '\0';
      windows_sortorder[0xd] = '\0';
      windows_sortorder[0xe] = '\0';
      windows_sortorder[0xf] = '\0';
      bVar1 = ParseName(locale_name,-1,language_subtag,0x20,(char *)0x0,0,script_subtag,0x20,
                        region_subtag,0x20,windows_sortorder,0x20);
      if (bVar1) {
        if (language_subtag[0] == '\0') {
          pcVar2 = "ParseLocaleName() returned empty language name.";
          line_number = 0x40c;
        }
        else {
          if (language_subtag[1] != '\0') {
            bVar1 = ON_String::EqualOrdinal("zh",-1,language_subtag,-1,true);
            if (!bVar1) {
              ON_String::ON_String(&cleaned_loc,language_subtag);
              ON_String::operator+=(&cleaned_loc,'-');
              ON_String::operator+=(&cleaned_loc,region_subtag);
              if (windows_sortorder[0] != '\0') {
                ON_String::operator+=(&cleaned_loc,'_');
                ON_String::operator+=(&cleaned_loc,windows_sortorder);
              }
              pcVar2 = ON_String::operator_cast_to_char_(&cleaned_loc);
              bVar1 = ON_String::EqualOrdinal("cs-CZ",-1,pcVar2,-1,true);
              OVar3 = 0x405;
              if (bVar1) {
                name = "cs-CZ";
LAB_004d3d7a:
                FromWindowsLCIDAndName(__return_storage_ptr__,OVar3,name);
                ON_String::~ON_String(&cleaned_loc);
                return __return_storage_ptr__;
              }
              pcVar2 = ON_String::operator_cast_to_char_(&cleaned_loc);
              bVar1 = ON_String::EqualOrdinal("de-DE",-1,pcVar2,-1,true);
              OVar3 = 0x407;
              if (bVar1) {
                name = "de-DE";
                goto LAB_004d3d7a;
              }
              pcVar2 = ON_String::operator_cast_to_char_(&cleaned_loc);
              bVar1 = ON_String::EqualOrdinal("en-US",-1,pcVar2,-1,true);
              OVar3 = 0x409;
              if (bVar1) {
                name = "en-US";
                goto LAB_004d3d7a;
              }
              pcVar2 = ON_String::operator_cast_to_char_(&cleaned_loc);
              name = "es-ES_tradnl";
              bVar1 = ON_String::EqualOrdinal("es-ES_tradnl",-1,pcVar2,-1,true);
              OVar3 = 0x40a;
              if (bVar1) goto LAB_004d3d7a;
              pcVar2 = ON_String::operator_cast_to_char_(&cleaned_loc);
              bVar1 = ON_String::EqualOrdinal("es-ES",-1,pcVar2,-1,true);
              OVar3 = 0xc0a;
              if (bVar1) {
                name = "es-ES";
                goto LAB_004d3d7a;
              }
              pcVar2 = ON_String::operator_cast_to_char_(&cleaned_loc);
              name = "fr-FR";
              bVar1 = ON_String::EqualOrdinal("fr-FR",-1,pcVar2,-1,true);
              OVar3 = 0x40c;
              if (bVar1) goto LAB_004d3d7a;
              pcVar2 = ON_String::operator_cast_to_char_(&cleaned_loc);
              bVar1 = ON_String::EqualOrdinal("it-IT",-1,pcVar2,-1,true);
              OVar3 = 0x410;
              if (bVar1) {
                name = "it-IT";
                goto LAB_004d3d7a;
              }
              pcVar2 = ON_String::operator_cast_to_char_(&cleaned_loc);
              bVar1 = ON_String::EqualOrdinal("ja-JP",-1,pcVar2,-1,true);
              OVar3 = 0x411;
              if (bVar1) {
                name = "ja-JP";
                goto LAB_004d3d7a;
              }
              pcVar2 = ON_String::operator_cast_to_char_(&cleaned_loc);
              bVar1 = ON_String::EqualOrdinal("ko-KR",-1,pcVar2,-1,true);
              OVar3 = 0x412;
              if (bVar1) {
                name = "ko-KR";
                goto LAB_004d3d7a;
              }
              pcVar2 = ON_String::operator_cast_to_char_(&cleaned_loc);
              bVar1 = ON_String::EqualOrdinal("pl-PL",-1,pcVar2,-1,true);
              OVar3 = 0x415;
              if (bVar1) {
                name = "pl-PL";
                goto LAB_004d3d7a;
              }
              pcVar2 = ON_String::operator_cast_to_char_(&cleaned_loc);
              bVar1 = ON_String::EqualOrdinal("pt-PT",-1,pcVar2,-1,true);
              OVar3 = 0x816;
              if (bVar1) {
                name = "pt-PT";
                goto LAB_004d3d7a;
              }
              bVar1 = ON_String::EqualOrdinal("cs",-1,language_subtag,-1,true);
              OVar3 = 0x405;
              name = "cs-CZ";
              if (bVar1) goto LAB_004d3d7a;
              bVar1 = ON_String::EqualOrdinal("de",-1,language_subtag,-1,true);
              OVar3 = 0x407;
              name = "de-DE";
              if (bVar1) goto LAB_004d3d7a;
              bVar1 = ON_String::EqualOrdinal("en",-1,language_subtag,-1,true);
              OVar3 = 0x409;
              name = "en-US";
              if (bVar1) goto LAB_004d3d7a;
              bVar1 = ON_String::EqualOrdinal("es",-1,language_subtag,-1,true);
              OVar3 = 0xc0a;
              name = "es-ES";
              if (bVar1) goto LAB_004d3d7a;
              bVar1 = ON_String::EqualOrdinal("fr",-1,language_subtag,-1,true);
              name = "fr-FR";
              OVar3 = 0x40c;
              if (bVar1) goto LAB_004d3d7a;
              bVar1 = ON_String::EqualOrdinal("it",-1,language_subtag,-1,true);
              OVar3 = 0x410;
              name = "it-IT";
              if (bVar1) goto LAB_004d3d7a;
              bVar1 = ON_String::EqualOrdinal("ja",-1,language_subtag,-1,true);
              OVar3 = 0x411;
              name = "ja-JP";
              if (bVar1) goto LAB_004d3d7a;
              bVar1 = ON_String::EqualOrdinal("ko",-1,language_subtag,-1,true);
              OVar3 = 0x412;
              name = "ko-KR";
              if (bVar1) goto LAB_004d3d7a;
              bVar1 = ON_String::EqualOrdinal("pl",-1,language_subtag,-1,true);
              OVar3 = 0x415;
              name = "pl-PL";
              if (bVar1) goto LAB_004d3d7a;
              bVar1 = ON_String::EqualOrdinal("pt",-1,language_subtag,-1,true);
              OVar3 = 0x816;
              name = "pt-PT";
              if (bVar1) goto LAB_004d3d7a;
              ON_String::~ON_String(&cleaned_loc);
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
                         ,0x459,"","Unsupported language name.");
              goto LAB_004d3689;
            }
            bVar1 = ON_String::EqualOrdinal("Hans",-1,script_subtag,-1,true);
            if (bVar1) {
LAB_004d376f:
              pcVar2 = "zh-CN";
              OVar3 = 0x804;
            }
            else {
              bVar1 = ON_String::EqualOrdinal("Hant",-1,script_subtag,-1,true);
              if (!bVar1) {
                bVar1 = ON_String::EqualOrdinal("CN",-1,region_subtag,-1,true);
                if (bVar1) goto LAB_004d376f;
                ON_String::EqualOrdinal("TW",-1,region_subtag,-1,true);
              }
              pcVar2 = "zh-TW";
              OVar3 = 0x404;
            }
            FromWindowsLCIDAndName(__return_storage_ptr__,OVar3,pcVar2);
            return __return_storage_ptr__;
          }
          pcVar2 = "ParseLocaleName() returned invalid language name.";
          line_number = 0x412;
        }
      }
      else {
        pcVar2 = "ParseLocaleName() failed.";
        line_number = 0x406;
      }
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
                 ,line_number,"",pcVar2);
    }
    __src = &Ordinal;
  }
  memcpy(__return_storage_ptr__,__src,0xa0);
  return __return_storage_ptr__;
}

Assistant:

ON_Locale ON_Locale::FromWindowsName(
    const char* locale_name
    )
{
  if (0 == locale_name || 0 == locale_name[0])
    return ON_Locale::InvariantCulture;

  if ('C' == locale_name[0] && 0 == locale_name[1] )
    return ON_Locale::Ordinal;

#if defined(ON_RUNTIME_WIN)

  const ON_wString buffer1(locale_name);
  const wchar_t* wlocale_name = static_cast< const wchar_t* >(buffer1);
  wchar_t buffer2[LOCALE_NAME_MAX_LENGTH] = { 0 };

  if (false == ::IsValidLocaleName(wlocale_name))
  {
    const int buffer2_capacity = (int)(sizeof(buffer2) / sizeof(buffer2[0]));
    if (0 != ::ResolveLocaleName(wlocale_name,buffer2,buffer2_capacity)
        && ::IsValidLocaleName(buffer2)
      )
    {
      wlocale_name = buffer2;
    }
    else
    {
      return ON_Locale::InvariantCulture;
    }
  }

  LCID windows_lcid = ::LocaleNameToLCID(
    wlocale_name,
    LOCALE_ALLOW_NEUTRAL_NAMES
    );

  if (0 == windows_lcid)
  {
    ON_ERROR("Windows ::LocaleNameToLCID() failed.");
    return ON_Locale::Ordinal;
  }

  char slocale_name[ON_Locale::BUFFER_MAXIMUM_CAPACITY] = { 0 };
  if (false == ASCIIWideToChar(wlocale_name, ON_wString::Length(wlocale_name), slocale_name, sizeof(slocale_name) / sizeof(slocale_name[0])))
  {
    ON_ERROR("locale_name contains invalid values.");
    return ON_Locale::Ordinal;
  }

  return ON_Locale::FromWindowsLCIDAndName(
    (ON__UINT32)windows_lcid,
    slocale_name
    );

#else

  char language_subtag[32] = { 0 };
  char script_subtag[32] = { 0 };
  char region_subtag[32] = { 0 };
  char windows_sortorder[32] = { 0 };
  if (false == ON_Locale::ParseName(
    locale_name,
    -1,
    language_subtag, sizeof(language_subtag) / sizeof(language_subtag[0]),
    nullptr, 0,
    script_subtag, sizeof(script_subtag) / sizeof(script_subtag[0]),
    region_subtag, sizeof(region_subtag) / sizeof(region_subtag[0]),
    windows_sortorder, sizeof(windows_sortorder) / sizeof(windows_sortorder[0])
    ))
  {
    ON_ERROR("ParseLocaleName() failed.");
    return ON_Locale::Ordinal;
  }

  if (0 == language_subtag[0])
  {
    ON_ERROR("ParseLocaleName() returned empty language name.");
    return ON_Locale::Ordinal;
  }

  if (0 == language_subtag[1])
  {
    ON_ERROR("ParseLocaleName() returned invalid language name.");
    return ON_Locale::Ordinal;
  }

  if ( ON_String::EqualOrdinal("zh", -1, language_subtag, -1, true) )
  {
    // Rhino supports two Chinese locales.
    if (ON_String::EqualOrdinal("Hans", -1, script_subtag, -1, true))
    {
      // Apple uses "zh-Hans" to mean BCP 47 "zh-CN"
      // January 26, 2024 - Tim
      // I don't think we should fail if the region is not set to China, "zh-Hans" is sufficient to choose "zh-CN"
      //if ( 0 == region_subtag[0] || ON_String::EqualOrdinal("CN", -1, region_subtag, -1, true) )
        return ON_Locale::FromWindowsLCIDAndName(ON_Locale::zh_CN_LCID, "zh-CN" );
    }
    else if (ON_String::EqualOrdinal("Hant", -1, script_subtag, -1, true))
    {
      // Apple uses "zh-Hant" to mean BCP 47 "zh-CN"
      // January 26, 2024 - Tim
      // I don't think we should fail if the region is not set to Taiwan, "zh-Hant" is sufficient to choose "zh-TW"
      //if ( 0 == region_subtag[0] || ON_String::EqualOrdinal("TW", -1, region_subtag, -1, true) )
        return ON_Locale::FromWindowsLCIDAndName(ON_Locale::zh_TW_LCID, "zh-TW" );
    }
    else if ( ON_String::EqualOrdinal("CN", -1, region_subtag, -1, true) )
      return ON_Locale::FromWindowsLCIDAndName(ON_Locale::zh_CN_LCID, "zh-CN" );
    else if ( ON_String::EqualOrdinal("TW", -1, region_subtag, -1, true) )
      return ON_Locale::FromWindowsLCIDAndName(ON_Locale::zh_TW_LCID, "zh-TW" );
    else
      return ON_Locale::FromWindowsLCIDAndName(ON_Locale::zh_TW_LCID, "zh-TW" );
  }
  else
  {
    // Rhino supports a single region and default script for these languages.
    ON_String cleaned_loc = language_subtag;
    cleaned_loc += '-';
    cleaned_loc +=region_subtag;
    if ( 0 != windows_sortorder[0])
    {
      cleaned_loc += '_';
      cleaned_loc += windows_sortorder;
    }
    
#define LANG_CASE(lcid,lang) if (ON_String::EqualOrdinal(lang, -1, cleaned_loc, -1, true)) return ON_Locale::FromWindowsLCIDAndName(lcid, lang )
    LANG_CASE( ON_Locale::cs_CZ_LCID, "cs-CZ" );
    LANG_CASE( ON_Locale::de_DE_LCID, "de-DE" );
    LANG_CASE( ON_Locale::en_US_LCID, "en-US" );
    LANG_CASE( ON_Locale::es_ES_tradnl_LCID, "es-ES_tradnl" ); // _tradnl is Windows sort order
    LANG_CASE( ON_Locale::es_ES_LCID, "es-ES" );
    LANG_CASE( ON_Locale::fr_FR_LCID, "fr-FR" );
    LANG_CASE( ON_Locale::it_IT_LCID, "it-IT" );
    LANG_CASE( ON_Locale::ja_JP_LCID, "ja-JP" );
    LANG_CASE( ON_Locale::ko_KR_LCID, "ko-KR" );
    LANG_CASE( ON_Locale::pl_PL_LCID, "pl-PL" );
    LANG_CASE( ON_Locale::pt_PT_LCID, "pt-PT" );
#undef LANG_CASE
    
    // Bail out clause to handle string like fr-US.
#define LANG_CASE_2(two_letter_lang_code,lcid,lang) if (ON_String::EqualOrdinal(two_letter_lang_code, -1, language_subtag, -1, true)) return ON_Locale::FromWindowsLCIDAndName(lcid, lang )
    LANG_CASE_2( "cs", ON_Locale::cs_CZ_LCID, "cs-CZ" );
    LANG_CASE_2( "de", ON_Locale::de_DE_LCID, "de-DE" );
    LANG_CASE_2( "en", ON_Locale::en_US_LCID, "en-US" );
    LANG_CASE_2( "es", ON_Locale::es_ES_LCID, "es-ES" );
    LANG_CASE_2( "fr", ON_Locale::fr_FR_LCID, "fr-FR" );
    LANG_CASE_2( "it", ON_Locale::it_IT_LCID, "it-IT" );
    LANG_CASE_2( "ja", ON_Locale::ja_JP_LCID, "ja-JP" );
    LANG_CASE_2( "ko", ON_Locale::ko_KR_LCID, "ko-KR" );
    LANG_CASE_2( "pl", ON_Locale::pl_PL_LCID, "pl-PL" );
    LANG_CASE_2( "pt", ON_Locale::pt_PT_LCID, "pt-PT" );
#undef LANG_CASE_2
  }

  ON_ERROR("Unsupported language name.");
  return ON_Locale::InvariantCulture;

#endif

}